

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O3

ssize_t __thiscall bitio::bitio_stream::write(bitio_stream *this,int __fd,void *__buf,size_t __n)

{
  uint64_t uVar1;
  uchar uVar2;
  ssize_t in_RAX;
  byte bVar3;
  undefined4 in_register_00000034;
  void *pvVar4;
  
  if (__buf != (void *)0x0) {
    bVar3 = this->bit_buffer;
    in_RAX = CONCAT71((int7)((ulong)in_RAX >> 8),this->bit_count);
    pvVar4 = (void *)0x0;
    do {
      bVar3 = (*(ulong *)(ui64_single_bit_masks + (0x3f - ((ulong)pvVar4 & 0xff)) * 8) &
              CONCAT44(in_register_00000034,__fd) << (-(char)__buf & 0x3fU)) != 0 | bVar3 * '\x02';
      this->bit_buffer = bVar3;
      uVar2 = (char)in_RAX + '\x01';
      in_RAX = CONCAT71((int7)((ulong)in_RAX >> 8),uVar2);
      this->bit_count = uVar2;
      if (uVar2 == '\b') {
        uVar1 = this->byte_index;
        this->byte_index = uVar1 + 1;
        this->byte_buffer[uVar1] = bVar3;
        if (this->byte_index == this->buffer_size) {
          fwrite(this->byte_buffer,1,this->byte_index,(FILE *)this->file);
          this->byte_index = 0;
        }
        in_RAX = 0;
        this->bit_buffer = '\0';
        this->bit_count = '\0';
        bVar3 = 0;
      }
      pvVar4 = (void *)((long)pvVar4 + 1);
    } while (__buf != pvVar4);
  }
  return in_RAX;
}

Assistant:

void bitio_stream::write(uint64_t obj, uint64_t n) {
    uint64_t i = 0;
    obj <<= 0x40 - n;

    unsigned char mask_index = 0;
    while (i++ < n) {
        bit_buffer <<= 1;
        bit_buffer += (obj & ui64_single_bit_masks[0x3f - mask_index++]) != 0;;
        bit_count++;
        if (bit_count == 8) {
            byte_buffer[byte_index++] = bit_buffer;
            if (byte_index == buffer_size) {
                wflush();
                byte_index = 0;
            }
            bit_buffer = 0;
            bit_count = 0;
        }

    }
}